

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O2

bool __thiscall
duckdb::ReadHeadComparator::operator()(ReadHeadComparator *this,ReadHead *a,ReadHead *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = a->location;
  uVar1 = a->size + uVar2;
  uVar3 = a->size + 0x4000 + uVar2;
  if (0xffffffffffffbfff < uVar1) {
    uVar3 = uVar1;
  }
  return uVar3 < b->location && uVar2 < b->location;
}

Assistant:

bool operator()(const ReadHead *a, const ReadHead *b) const {
		auto a_start = a->location;
		auto a_end = a->location + a->size;
		auto b_start = b->location;

		if (a_end <= NumericLimits<idx_t>::Maximum() - ALLOW_GAP) {
			a_end += ALLOW_GAP;
		}

		return a_start < b_start && a_end < b_start;
	}